

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O2

aom_image_t * anon_unknown.dwarf_10027dd::CreateGrayImage(aom_img_fmt_t fmt,uint w,uint h)

{
  uint uVar1;
  aom_image_t *paVar2;
  uint i;
  ulong __n;
  uint i_1;
  uint uVar3;
  
  uVar3 = 0;
  paVar2 = aom_img_alloc((aom_image_t *)0x0,AOM_IMG_FMT_I420,fmt,w,1);
  if (paVar2 != (aom_image_t *)0x0) {
    for (; uVar1 = paVar2->d_h, uVar3 < uVar1; uVar3 = uVar3 + 1) {
      memset(paVar2->planes[0] + paVar2->stride[0] * uVar3,0x80,(ulong)paVar2->d_w);
    }
    __n = (ulong)(paVar2->d_w + 1 >> 1);
    for (uVar3 = 0; uVar1 + 1 >> 1 != uVar3; uVar3 = uVar3 + 1) {
      memset(paVar2->planes[1] + paVar2->stride[1] * uVar3,0x80,__n);
      memset(paVar2->planes[2] + paVar2->stride[2] * uVar3,0x80,__n);
    }
  }
  return paVar2;
}

Assistant:

aom_image_t *CreateGrayImage(aom_img_fmt_t fmt, unsigned int w,
                             unsigned int h) {
  aom_image_t *const image = aom_img_alloc(nullptr, fmt, w, h, 1);
  if (!image) return image;

  for (unsigned int i = 0; i < image->d_h; ++i) {
    memset(image->planes[0] + i * image->stride[0], 128, image->d_w);
  }
  const unsigned int uv_h = (image->d_h + 1) / 2;
  const unsigned int uv_w = (image->d_w + 1) / 2;
  for (unsigned int i = 0; i < uv_h; ++i) {
    memset(image->planes[1] + i * image->stride[1], 128, uv_w);
    memset(image->planes[2] + i * image->stride[2], 128, uv_w);
  }
  return image;
}